

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

_Bool store_check_num(store *store,object *obj)

{
  object *poVar1;
  _Bool _Var2;
  bool bVar3;
  object **ppoVar4;
  
  bVar3 = true;
  if ((store->stock_size <= (short)(ushort)store->stock_num) && (store->sidx != store_merchant_idx))
  {
    ppoVar4 = &store->stock;
    if (store->sidx == store_home_idx) {
      do {
        poVar1 = *ppoVar4;
        bVar3 = poVar1 != (object *)0x0;
        if (poVar1 == (object *)0x0) {
          return bVar3;
        }
        _Var2 = object_mergeable(poVar1,obj,OSTACK_PACK);
        ppoVar4 = &poVar1->next;
      } while (!_Var2);
    }
    else {
      do {
        poVar1 = *ppoVar4;
        bVar3 = poVar1 != (object *)0x0;
        if (poVar1 == (object *)0x0) {
          return bVar3;
        }
        _Var2 = object_mergeable(poVar1,obj,OSTACK_STORE);
        ppoVar4 = &poVar1->next;
      } while (!_Var2);
    }
  }
  return bVar3;
}

Assistant:

bool store_check_num(struct store *store, const struct object *obj)
{
	struct object *stock_obj;

	/* Free space is always usable */
	if (store->stock_num < store->stock_size) return true;

	/* Merchant will take anything */
	if (store_is_merchant(store)) return true;

	/* The "home" acts like the player */
	if (store_is_home(store)) {
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Can the new object be combined with the old one? */
			if (object_mergeable(stock_obj, obj, OSTACK_PACK))
				return true;
		}
	} else {
		/* Normal stores do special stuff */
		for (stock_obj = store->stock; stock_obj; stock_obj = stock_obj->next) {
			/* Can the new object be combined with the old one? */
			if (object_mergeable(stock_obj, obj, OSTACK_STORE))
				return true;
		}
	}

	/* But there was no room at the inn... */
	return false;
}